

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.hpp
# Opt level: O0

void __thiscall
rudp::rudp_server::
send<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (rudp_server *this,uint32_t session_id,
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          begin,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                end,function<void_(bool)> *cb)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  element_type *this_00;
  bool local_69;
  _Self local_50;
  _Self local_48;
  iterator sess;
  _Self local_38;
  iterator endpoint;
  function<void_(bool)> *cb_local;
  rudp_server *prStack_20;
  uint32_t session_id_local;
  rudp_server *this_local;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  end_local;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  begin_local;
  
  endpoint._M_node = (_Base_ptr)cb;
  cb_local._4_4_ = session_id;
  prStack_20 = this;
  this_local = (rudp_server *)end._M_current;
  end_local = begin;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
       ::find(&this->session_bindings,(key_type *)((long)&cb_local + 4));
  sess._M_node = (_Base_ptr)
                 std::
                 map<unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                 ::end(&this->session_bindings);
  bVar1 = std::operator!=(&local_38,(_Self *)&sess);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
             ::operator->(&local_38);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>_>
         ::find(&this->sessions,&ppVar2->second);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>_>
         ::end(&this->sessions);
    bVar1 = std::operator!=(&local_48,&local_50);
    local_69 = false;
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>
               ::operator->(&local_48);
      local_69 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&ppVar3->second);
    }
    if (local_69 == false) {
      std::function<void_(bool)>::operator()((function<void_(bool)> *)endpoint._M_node,false);
    }
    else {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>
               ::operator->(&local_48);
      this_00 = std::__shared_ptr_access<rudp::session,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<rudp::session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&ppVar3->second);
      session::
      send<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (this_00,end_local,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )this_local,(send_cb_t *)endpoint._M_node);
    }
  }
  else {
    std::function<void_(bool)>::operator()((function<void_(bool)> *)endpoint._M_node,false);
  }
  return;
}

Assistant:

void send(
    uint32_t session_id,
    Iterator begin, Iterator end,
    const std::function< void( bool ) > &cb
  ) {
    auto endpoint = session_bindings.find( session_id );
    if( endpoint != session_bindings.end() ) {
      auto sess = sessions.find( endpoint->second );
      if( sess != sessions.end() && sess->second )
        sess->second->send( begin, end, cb );
      else cb( false );
    }
    else cb( false );
  }